

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined4 uVar3;
  Context *pCVar4;
  TestNode *this_00;
  TestNode *pTVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  TestNode *node;
  long *plVar8;
  long lVar9;
  long *plVar10;
  VertexTextureTests *pVVar11;
  long lVar12;
  string name;
  long local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  TestNode *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8 [2];
  long local_98 [2];
  TestNode *local_88;
  VertexTextureTests *local_80;
  TestNode *local_78;
  TestNode *local_70;
  TestNode *local_68;
  TestNode *local_60;
  TestNode *local_58;
  TestNode *local_50;
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  this_00 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,pCVar4->m_testCtx,"2d","2D Vertex Texture Tests");
  this_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  this_00[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"cube","Cube Map Vertex Texture Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar4->m_testCtx,"2d_array","2D Array Vertex Texture Tests");
  ((TestNode *)&pTVar6->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar6[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_f0 = pTVar6;
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar4->m_testCtx,"3d","3D Vertex Texture Tests");
  ((TestNode *)&pTVar6->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar6[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_70 = pTVar5;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"filtering",
             "2D Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar4->m_testCtx,"wrap","2D Vertex Texture Wrap Tests");
  ((TestNode *)&pTVar7->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar7[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_88 = pTVar5;
  local_50 = pTVar7;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_78 = pTVar5;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"wrap","Cube Map Vertex Texture Wrap Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar4->m_testCtx,"filtering",
             "2D Array Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar7->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar7[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_58 = pTVar5;
  local_40 = pTVar7;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"wrap","2D Array Vertex Texture Wrap Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_60 = pTVar5;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"filtering",
             "3D Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_68 = pTVar6;
  node = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_48 = pTVar5;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar4->m_testCtx,"wrap","3D Vertex Texture Wrap Tests");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  node[1]._vptr_TestNode = (_func_int **)pCVar4;
  tcu::TestNode::addChild(this_00,local_88);
  tcu::TestNode::addChild(this_00,local_50);
  pTVar6 = local_70;
  tcu::TestNode::addChild(local_70,local_78);
  tcu::TestNode::addChild(pTVar6,local_58);
  pTVar5 = local_f0;
  tcu::TestNode::addChild(local_f0,local_40);
  tcu::TestNode::addChild(pTVar5,local_60);
  pTVar7 = local_68;
  tcu::TestNode::addChild(local_68,local_48);
  local_38 = node;
  tcu::TestNode::addChild(pTVar7,node);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar9 = 0;
  local_80 = this;
  do {
    pTVar5 = (TestNode *)(init::minFilterModes + lVar9);
    lVar12 = 0;
    local_f0 = pTVar5;
    local_68 = (TestNode *)lVar9;
    do {
      local_158 = 8;
      local_70 = (TestNode *)lVar12;
      do {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a8);
        local_c8 = &local_b8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar8[3];
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar8;
        }
        local_c0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_d8 = *plVar10;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar10;
          local_e8 = (long *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_150 = &local_140;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_140 = *plVar10;
          lStack_138 = plVar8[3];
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar8;
        }
        local_148 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_130 = &local_120;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = plVar8[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110 = &local_100;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar8[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar8;
        }
        local_108 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pTVar6 = (TestNode *)operator_new(0xa0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        GVar1 = ((anon_struct_16_2_3f8b7511 *)pTVar5)->mode;
        GVar2 = init::magFilterModes[lVar12].mode;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_158);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                   glcts::fixed_sample_locations_values + 1);
        pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_0217e940;
        *(GLenum *)&pTVar6[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar6[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar3;
        pTVar6[1].m_name._M_string_length = 0;
        pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_88,pTVar6);
        this = local_80;
        pTVar5 = local_f0;
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        local_158 = local_158 + 0x10;
      } while (local_158 != 0x38);
      lVar12 = (long)local_70 + 1;
    } while (local_70 == (TestNode *)0x0);
    lVar9 = (long)local_68 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  do {
    lVar12 = 8;
    local_f0 = (TestNode *)lVar9;
    do {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,0x1b32ab9);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_150 = &local_140;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_140 = *plVar10;
        lStack_138 = plVar8[3];
      }
      else {
        local_140 = *plVar10;
        local_150 = (long *)*plVar8;
      }
      local_148 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
      local_130 = &local_120;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_120 = *plVar10;
        lStack_118 = plVar8[3];
      }
      else {
        local_120 = *plVar10;
        local_130 = (long *)*plVar8;
      }
      local_128 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_110 = &local_100;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar8[3];
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar8;
      }
      local_108 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar9].mode;
      uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar12);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                 glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_0217e940;
      pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_50,pTVar5);
      this = local_80;
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x38);
    lVar9 = (long)local_f0 + 1;
  } while (lVar9 != 3);
  lVar9 = 0;
  do {
    lVar12 = 0;
    local_70 = (TestNode *)lVar9;
    do {
      local_f0 = (TestNode *)(init::magFilterModes + lVar12);
      local_158 = 8;
      local_88 = (TestNode *)lVar12;
      do {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar8[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar8;
        }
        local_c0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_d8 = *plVar10;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar10;
          local_e8 = (long *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_150 = &local_140;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_140 = *plVar10;
          lStack_138 = plVar8[3];
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar8;
        }
        local_148 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_130 = &local_120;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = plVar8[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110 = &local_100;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar8[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar8;
        }
        local_108 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa0);
        pCVar4 = (local_80->super_TestCaseGroup).m_context;
        GVar1 = init::minFilterModes[lVar9].mode;
        GVar2 = *(GLenum *)&local_f0->m_testCtx;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_158);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_0217e978;
        *(GLenum *)&pTVar5[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
        pTVar5[1].m_name._M_string_length = 0;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_78,pTVar5);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        local_158 = local_158 + 0x10;
      } while (local_158 != 0x38);
      lVar12 = (long)local_88 + 1;
    } while (local_88 == (TestNode *)0x0);
    lVar9 = (long)local_70 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  pVVar11 = local_80;
  do {
    lVar12 = 8;
    local_f0 = (TestNode *)lVar9;
    do {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,0x1b32ab9);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_150 = &local_140;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_140 = *plVar10;
        lStack_138 = plVar8[3];
      }
      else {
        local_140 = *plVar10;
        local_150 = (long *)*plVar8;
      }
      local_148 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
      local_130 = &local_120;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_120 = *plVar10;
        lStack_118 = plVar8[3];
      }
      else {
        local_120 = *plVar10;
        local_130 = (long *)*plVar8;
      }
      local_128 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_110 = &local_100;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar8[3];
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar8;
      }
      local_108 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (pVVar11->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar9].mode;
      uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar12);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                 glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_0217e978;
      pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_58,pTVar5);
      pVVar11 = local_80;
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x38);
    lVar9 = (long)local_f0 + 1;
  } while (lVar9 != 3);
  lVar9 = 0;
  do {
    lVar12 = 0;
    local_78 = (TestNode *)lVar9;
    do {
      local_f0 = (TestNode *)(init::magFilterModes + lVar12);
      local_158 = 8;
      local_88 = (TestNode *)lVar12;
      do {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar8[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar8;
        }
        local_c0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_d8 = *plVar10;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar10;
          local_e8 = (long *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_150 = &local_140;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_140 = *plVar10;
          lStack_138 = plVar8[3];
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar8;
        }
        local_148 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_130 = &local_120;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = plVar8[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110 = &local_100;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar8[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar8;
        }
        local_108 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa0);
        pCVar4 = (local_80->super_TestCaseGroup).m_context;
        GVar1 = init::minFilterModes[lVar9].mode;
        GVar2 = *(GLenum *)&local_f0->m_testCtx;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_158);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex2DArrayTextureCase_0217e9b0;
        *(GLenum *)&pTVar5[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
        pTVar5[1].m_name._M_string_length = 0;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_40,pTVar5);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        local_158 = local_158 + 0x10;
      } while (local_158 != 0x38);
      lVar12 = (long)local_88 + 1;
    } while (local_88 == (TestNode *)0x0);
    lVar9 = (long)local_78 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  pVVar11 = local_80;
  do {
    lVar12 = 8;
    local_f0 = (TestNode *)lVar9;
    do {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,0x1b32ab9);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_150 = &local_140;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_140 = *plVar10;
        lStack_138 = plVar8[3];
      }
      else {
        local_140 = *plVar10;
        local_150 = (long *)*plVar8;
      }
      local_148 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
      local_130 = &local_120;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_120 = *plVar10;
        lStack_118 = plVar8[3];
      }
      else {
        local_120 = *plVar10;
        local_130 = (long *)*plVar8;
      }
      local_128 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_110 = &local_100;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar8[3];
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar8;
      }
      local_108 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (pVVar11->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar9].mode;
      uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar12);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                 glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex2DArrayTextureCase_0217e9b0;
      pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_60,pTVar5);
      pVVar11 = local_80;
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x38);
    lVar9 = (long)local_f0 + 1;
  } while (lVar9 != 3);
  lVar9 = 0;
  do {
    lVar12 = 0;
    local_78 = (TestNode *)lVar9;
    do {
      local_f0 = (TestNode *)(init::magFilterModes + lVar12);
      local_158 = 8;
      local_88 = (TestNode *)lVar12;
      do {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a8);
        local_c8 = &local_b8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar8[3];
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar8;
        }
        local_c0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_d8 = *plVar10;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar10;
          local_e8 = (long *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_150 = &local_140;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_140 = *plVar10;
          lStack_138 = plVar8[3];
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar8;
        }
        local_148 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_130 = &local_120;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = plVar8[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110 = &local_100;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar8[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar8;
        }
        local_108 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa8);
        pCVar4 = (pVVar11->super_TestCaseGroup).m_context;
        GVar1 = init::minFilterModes[lVar9].mode;
        GVar2 = *(GLenum *)&local_f0->m_testCtx;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_158);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex3DTextureCase_0217e9e8;
        *(GLenum *)&pTVar5[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
        *(undefined4 *)&pTVar5[1].m_name._M_string_length = uVar3;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
        tcu::TestNode::addChild(local_48,pTVar5);
        pVVar11 = local_80;
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        local_158 = local_158 + 0x10;
      } while (local_158 != 0x38);
      lVar12 = (long)local_88 + 1;
    } while (local_88 == (TestNode *)0x0);
    lVar9 = (long)local_78 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  do {
    local_88 = (TestNode *)0x0;
    local_78 = (TestNode *)lVar9;
    do {
      local_f0 = (TestNode *)(init::wrapModes + (long)local_88);
      local_158 = 8;
      do {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar8[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar8;
        }
        local_c0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_d8 = *plVar10;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar10;
          local_e8 = (long *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_150 = &local_140;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_140 = *plVar10;
          lStack_138 = plVar8[3];
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar8;
        }
        local_148 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_130 = &local_120;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = plVar8[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110 = &local_100;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar8[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar8;
        }
        local_108 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa8);
        pCVar4 = (local_80->super_TestCaseGroup).m_context;
        GVar1 = init::wrapModes[lVar9].mode;
        GVar2 = *(GLenum *)&local_f0->m_testCtx;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_158);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_110,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex3DTextureCase_0217e9e8;
        pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
        *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_string_length = uVar3;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
        tcu::TestNode::addChild(local_38,pTVar5);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        local_158 = local_158 + 0x10;
      } while (local_158 != 0x38);
      local_88 = (TestNode *)((long)local_88 + 1);
    } while (local_88 != (TestNode *)0x3);
    lVar9 = (long)local_78 + 1;
  } while (lVar9 != 3);
  return 3;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const group2DArray			= new TestCaseGroup(m_context, "2d_array",		"2D Array Vertex Texture Tests");
	TestCaseGroup* const group3D				= new TestCaseGroup(m_context, "3d",			"3D Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup2DArray	= new TestCaseGroup(m_context, "filtering",		"2D Array Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2DArray		= new TestCaseGroup(m_context, "wrap",			"2D Array Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup3D		= new TestCaseGroup(m_context, "filtering",		"3D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup3D			= new TestCaseGroup(m_context, "wrap",			"3D Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);
	group2DArray->addChild(filteringGroup2DArray);
	group2DArray->addChild(wrapGroup2DArray);
	group3D->addChild(filteringGroup3D);
	group3D->addChild(wrapGroup3D);

	addChild(group2D);
	addChild(groupCube);
	addChild(group2DArray);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));

	// 2D array cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																		 name.c_str(), "",
																		 minFilterModes[minFilter].mode,
																		 magFilterModes[magFilter].mode,
																		 wrapModes[wrapMode].mode,
																		 wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																	name.c_str(), "",
																	GL_LINEAR_MIPMAP_LINEAR,
																	GL_LINEAR,
																	wrapModes[wrapSMode].mode,
																	wrapModes[wrapTMode].mode));
		}));

	// 3D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup3D->addChild(new Vertex3DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
	FOR_EACH(wrapRMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name + "_" + wrapModes[wrapRMode].name;

			wrapGroup3D->addChild(new Vertex3DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode,
														  wrapModes[wrapRMode].mode));
		})));
}